

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unix-sockets.c
# Opt level: O3

int lws_plat_rawudp_broadcast
              (uint8_t *p,uint8_t *canned,size_t canned_len,size_t n,int fd,char *iface)

{
  uint uVar1;
  ssize_t sVar2;
  ulong uVar3;
  sockaddr local_3c;
  undefined4 local_2c;
  
  memcpy(p,canned,canned_len);
  *(ushort *)(p + 2) = (ushort)n << 8 | (ushort)n >> 8;
  uVar1 = 0;
  uVar3 = 0xfffffffffffffffe;
  do {
    uVar1 = uVar1 + (ushort)(*(ushort *)(p + uVar3 + 2) << 8 | *(ushort *)(p + uVar3 + 2) >> 8);
    uVar3 = uVar3 + 2;
  } while (uVar3 < 0x12);
  uVar1 = (uVar1 >> 0x10) + uVar1 ^ 0xffff;
  p[10] = (uint8_t)(uVar1 >> 8);
  p[0xb] = (uint8_t)uVar1;
  p[0x18] = (uint8_t)(n - 0x14 >> 8);
  p[0x19] = (uint8_t)(n - 0x14);
  local_2c = 0;
  local_3c.sa_family = 0x11;
  local_3c.sa_data[0] = '\b';
  local_3c.sa_data[1] = '\0';
  local_3c.sa_data[6] = '\0';
  local_3c.sa_data[7] = '\0';
  local_3c.sa_data[8] = '\0';
  local_3c.sa_data[9] = '\x06';
  local_3c.sa_data[10] = '\0';
  local_3c.sa_data[0xb] = '\0';
  local_3c.sa_data[0xc] = '\0';
  local_3c.sa_data[0xd] = '\0';
  local_3c.sa_data._2_4_ = if_nametoindex(iface);
  local_3c.sa_data._10_4_ = 0xffffffff;
  local_2c = CONCAT22(local_2c._2_2_,0xffff);
  sVar2 = sendto(fd,p,n,0,&local_3c,0x14);
  return (int)sVar2;
}

Assistant:

int
lws_plat_rawudp_broadcast(uint8_t *p, const uint8_t *canned, size_t canned_len,
			  size_t n, int fd, const char *iface)
{
#if defined(__linux__)
	struct sockaddr_ll sll;
	uint16_t *p16 = (uint16_t *)p;
	uint32_t ucs = 0;

	memcpy(p, canned, canned_len);

	p[2] = (uint8_t)(n >> 8);
	p[3] = (uint8_t)(n);

	while (p16 < (uint16_t *)(p + 20))
		ucs += ntohs(*p16++);

	ucs += ucs >> 16;
	ucs ^= 0xffff;

	p[10] = (uint8_t)(ucs >> 8);
	p[11] = (uint8_t)(ucs);
	p[24] = (uint8_t)((n - 20) >> 8);
	p[25] = (uint8_t)((n - 20));

	memset(&sll, 0, sizeof(sll));
	sll.sll_family = AF_PACKET;
	sll.sll_protocol = htons(0x800);
	sll.sll_halen = 6;
	sll.sll_ifindex = (int)if_nametoindex(iface);
	memset(sll.sll_addr, 0xff, 6);

	return (int)sendto(fd, p, n, 0, (struct sockaddr *)&sll, sizeof(sll));
#else
	lwsl_err("%s: UNIMPLEMENTED on this platform\n", __func__);

	return -1;
#endif
}